

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O2

void __thiscall
KDReports::AbstractTableElementPrivate::fillConstraints
          (AbstractTableElementPrivate *this,QTextTableFormat *tableFormat)

{
  long lVar1;
  ColumnConstraint *pCVar2;
  qreal qVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QTextLength local_60;
  QTextTableFormat *local_50;
  QVector<QTextLength> constraints;
  
  lVar1 = (this->m_constraints).d.size;
  if (lVar1 != 0) {
    constraints.d.d = (Data *)0x0;
    constraints.d.ptr = (QTextLength *)0x0;
    constraints.d.size = 0;
    local_50 = tableFormat;
    QList<QTextLength>::reserve(&constraints,lVar1);
    pCVar2 = (this->m_constraints).d.ptr;
    lVar1 = (this->m_constraints).d.size;
    for (lVar4 = 0; lVar1 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      local_60.lengthType = VariableLength;
      local_60.fixedValueOrPercentage = 0.0;
      if (*(int *)(pCVar2 + lVar4 + 8) == 0) {
        qVar3 = mmToPixels(*(qreal *)(pCVar2 + lVar4));
        uVar5 = SUB84(qVar3,0);
        uVar6 = (undefined4)((ulong)qVar3 >> 0x20);
        local_60.lengthType = FixedLength;
LAB_0013167a:
        local_60.fixedValueOrPercentage = (qreal)CONCAT44(uVar6,uVar5);
      }
      else if (*(int *)(pCVar2 + lVar4 + 8) == 1) {
        uVar5 = (undefined4)*(undefined8 *)(pCVar2 + lVar4);
        uVar6 = (undefined4)((ulong)*(undefined8 *)(pCVar2 + lVar4) >> 0x20);
        local_60.lengthType = PercentageLength;
        goto LAB_0013167a;
      }
      QList<QTextLength>::emplaceBack<QTextLength_const&>(&constraints,&local_60);
    }
    QTextTableFormat::setColumnWidthConstraints(local_50,&constraints);
    QArrayDataPointer<QTextLength>::~QArrayDataPointer(&constraints.d);
  }
  return;
}

Assistant:

void KDReports::AbstractTableElementPrivate::fillConstraints(QTextTableFormat *tableFormat) const
{
    if (!m_constraints.isEmpty()) {
        QVector<QTextLength> constraints;
        constraints.reserve(m_constraints.size());
        for (const auto &c : m_constraints) {
            QTextLength length; // Variable by default
            switch (c.unit) {
            case Millimeters:
                length = QTextLength(QTextLength::FixedLength, mmToPixels(c.width));
                break;
            case Percent:
                length = QTextLength(QTextLength::PercentageLength, c.width);
                break;
            }
            constraints.append(length);
        }
        tableFormat->setColumnWidthConstraints(constraints);
    }
}